

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void golf_audio_update(float dt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  _sound_t *p_Var4;
  float fVar5;
  map_iter_t mVar6;
  float sign;
  float b;
  float a;
  int j_1;
  int j;
  int n;
  float scale;
  _sound_t *s;
  map_iter_t iter;
  char *key;
  float *pfStack_20;
  int i;
  float *buffer2;
  float *buffer;
  int num_samples;
  float dt_local;
  
  buffer._4_4_ = dt;
  buffer._0_4_ = saudio_expect();
  if (L'\0' < (wchar_t)buffer) {
    buffer2 = (float *)golf_alloc_tracked((long)(wchar_t)buffer << 2,
                                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                         );
    pfStack_20 = (float *)golf_alloc_tracked((long)(wchar_t)buffer << 2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/audio.c"
                                            );
    for (key._4_4_ = L'\0'; key._4_4_ < (wchar_t)buffer; key._4_4_ = key._4_4_ + L'\x01') {
      buffer2[key._4_4_] = 0.0;
    }
    mVar6 = map_iter_();
    iter._0_8_ = mVar6.node;
    s._0_4_ = mVar6.bucketidx;
    while (iter.node = (map_node_t *)map_next_(&_sounds.base,(map_iter_t *)&s),
          iter.node != (map_node_t *)0x0) {
      p_Var4 = (_sound_t *)map_get_(&_sounds.base,(char *)iter.node);
      j = 0x3f800000;
      _sounds.ref = p_Var4;
      if ((p_Var4->on & 1U) != 0) {
        if ((p_Var4->stopping & 1U) != 0) {
          p_Var4->stopping_t = buffer._4_4_ + p_Var4->stopping_t;
          if (p_Var4->stopping_length <= p_Var4->stopping_t &&
              p_Var4->stopping_t != p_Var4->stopping_length) {
            p_Var4->stopping_t = p_Var4->stopping_length;
            p_Var4->stopping = false;
            p_Var4->on = false;
          }
          j = (int)(1.0 - p_Var4->stopping_t / p_Var4->stopping_length);
        }
        stb_vorbis_seek(p_Var4->stream,p_Var4->cur_pos);
        fVar2 = (float)stb_vorbis_get_samples_float
                                 (p_Var4->stream,1,&stack0xffffffffffffffe0,(wchar_t)buffer);
        for (a = fVar2; (int)a < (wchar_t)buffer; a = (float)((int)a + 1)) {
          pfStack_20[(int)a] = 0.0;
        }
        for (b = 0.0; (int)b < (wchar_t)buffer; b = (float)((int)b + 1)) {
          fVar1 = buffer2[(int)b];
          fVar5 = p_Var4->volume * (float)j * pfStack_20[(int)b];
          iVar3 = -1;
          if (0.0 < fVar1 + fVar5) {
            iVar3 = 1;
          }
          buffer2[(int)b] = -(fVar1 * fVar5) * (float)iVar3 + fVar1 + fVar5;
        }
        if (fVar2 == 0.0) {
          if ((p_Var4->repeat & 1U) == 0) {
            p_Var4->on = false;
          }
          else {
            p_Var4->cur_pos = 0;
          }
        }
        p_Var4->cur_pos = (int)fVar2 + p_Var4->cur_pos;
      }
    }
    saudio_push(buffer2,(wchar_t)buffer);
    golf_free_tracked(pfStack_20);
    golf_free_tracked(buffer2);
  }
  return;
}

Assistant:

void golf_audio_update(float dt) {
    int num_samples = saudio_expect();
    if (num_samples <= 0) {
        return;
    }

    float *buffer = golf_alloc(sizeof(float) * num_samples);
    float *buffer2 = golf_alloc(sizeof(float) * num_samples);
    for (int i = 0; i < num_samples; i++) {
        buffer[i] = 0;
    }

    const char *key;
    map_iter_t iter = map_iter(&m);
    while ((key = map_next(&_sounds, &iter))) {
        _sound_t *s = map_get(&_sounds, key);
        float scale = 1;
        if (!s->on) continue;
        if (s->stopping) {
            s->stopping_t += dt;
            if (s->stopping_t > s->stopping_length) {
                s->stopping_t = s->stopping_length;
                s->stopping = false;
                s->on = false;
            }
            scale = 1 - s->stopping_t / s->stopping_length;
        }

        stb_vorbis_seek(s->stream, s->cur_pos);
        int n = stb_vorbis_get_samples_float(s->stream, 1, &buffer2, num_samples);
        for (int j = n; j < num_samples; j++) {
            buffer2[j] = 0;
        }
        for (int j = 0; j < num_samples; j++) {
            float a = buffer[j];
            float b = s->volume * scale * buffer2[j];
            float sign = (float) ((a + b) > 0 ? 1 : -1);
            buffer[j] = a + b - a * b * sign;
        }
        if (n == 0) {
            if (s->repeat) {
                s->cur_pos = 0;
            }
            else {
                s->on = false;
            }
        }
        s->cur_pos += n;
    }

    saudio_push(buffer, num_samples);
    golf_free(buffer2);
    golf_free(buffer);
}